

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

void __thiscall
kratos::AssignStmt::AssignStmt
          (AssignStmt *this,shared_ptr<kratos::Var> *left,shared_ptr<kratos::Var> *right,
          AssignmentType type)

{
  element_type *peVar1;
  element_type *peVar2;
  Var *pVVar3;
  int64_t value;
  uint *puVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint32_t uVar8;
  ConstantLegal CVar9;
  UserException *pUVar10;
  StmtException *this_00;
  VarException *pVVar11;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar12;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<kratos::IRNode_*> __l_00;
  initializer_list<const_kratos::IRNode_*> __l_01;
  initializer_list<kratos::IRNode_*> __l_02;
  element_type *local_e8;
  element_type *local_e0;
  element_type *local_d8;
  element_type *peStack_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8 [4];
  _Alloc_hider local_98;
  element_type *right_ptr;
  undefined1 auStack_78 [8];
  shared_ptr<kratos::Const> const_;
  allocator_type local_31;
  
  Stmt::Stmt(&this->super_Stmt,Assign);
  (this->super_Stmt).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002c6418;
  peVar1 = (left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this->left_ = peVar1;
  peVar2 = (right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this->right_ = peVar2;
  this->assign_type_ = type;
  (this->delay_).super__Optional_base<kratos::EventControl,_true,_true>._M_payload.
  super__Optional_payload_base<kratos::EventControl>._M_engaged = false;
  if (peVar1 == (element_type *)0x0) {
    pUVar10 = (UserException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)auStack_78,"left hand side is empty",
               (allocator<char> *)&stack0xffffffffffffff68);
    UserException::UserException(pUVar10,(string *)auStack_78);
    __cxa_throw(pUVar10,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  if (peVar2 == (element_type *)0x0) {
    pUVar10 = (UserException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)auStack_78,"right hand side is empty",
               (allocator<char> *)&stack0xffffffffffffff68);
    UserException::UserException(pUVar10,(string *)auStack_78);
    __cxa_throw(pUVar10,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  if (peVar1->is_signed_ != peVar2->is_signed_) {
    pVVar11 = (VarException *)__cxa_allocate_exception(0x10);
    (*(((left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_IRNode).
      _vptr_IRNode[0x1f])(&local_d8);
    (*(((right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_IRNode).
      _vptr_IRNode[0x1f])(local_b8);
    auStack_78 = (undefined1  [8])local_d8;
    const_.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_d0;
    const_.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_b8[0];
    bVar12 = fmt::v7::to_string_view<char,_0>
                       ("left ({0})\'s sign does not match with right ({1}). {2} <- {3}");
    format_str.data_ = (char *)bVar12.size_;
    format_str.size_ = 0x77dd;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)auStack_78;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)&stack0xffffffffffffff68,(detail *)bVar12.data_,format_str,args);
    local_e8 = (left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_e0 = (right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    __l._M_len = 2;
    __l._M_array = (iterator)&local_e8;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)auStack_78
               ,__l,&local_31);
    VarException::VarException
              (pVVar11,(string *)&stack0xffffffffffffff68,
               (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)auStack_78
              );
    __cxa_throw(pVVar11,&VarException::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar6 = (*(peVar1->super_IRNode)._vptr_IRNode[7])();
  iVar7 = (*(((right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_IRNode)._vptr_IRNode[7])();
  if (iVar6 != iVar7) {
    pVVar3 = (right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (pVVar3->type_ == ConstValue) {
      Var::as<kratos::Const>((Var *)auStack_78);
      value = *(int64_t *)((long)auStack_78 + 0x270);
      uVar8 = (*(((left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_IRNode)._vptr_IRNode[7])();
      CVar9 = Const::is_legal(value,uVar8,
                              ((left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->is_signed_);
      if (CVar9 != Legal) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&const_);
        goto LAB_001a1319;
      }
      uVar8 = (*(((left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_IRNode)._vptr_IRNode[7])();
      Const::set_width((Const *)auStack_78,uVar8);
    }
    else {
      bVar5 = IterVar::has_iter_var(pVVar3);
      if (!bVar5) goto LAB_001a1319;
      pVVar3 = (right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      uVar8 = (*(((left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_IRNode)._vptr_IRNode[7])();
      bVar5 = IterVar::safe_to_resize
                        (pVVar3,uVar8,
                         ((left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                         )->is_signed_);
      if (!bVar5) goto LAB_001a1319;
      local_98._M_p =
           (pointer)(right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      uVar8 = (*(((left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_IRNode)._vptr_IRNode[7])();
      IterVar::fix_width((Var **)&stack0xffffffffffffff68,uVar8);
      std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)auStack_78,
                 (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)(local_98._M_p + 0x68));
      std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)auStack_78);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&const_);
    iVar6 = (*(((left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_IRNode)._vptr_IRNode[7])();
    iVar7 = (*(((right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_IRNode)._vptr_IRNode[7])();
    if (iVar6 != iVar7) {
LAB_001a1319:
      pVVar11 = (VarException *)__cxa_allocate_exception(0x10);
      (*(((left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_IRNode)
        ._vptr_IRNode[0x1f])(&local_d8);
      (*(((right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_IRNode
        )._vptr_IRNode[0x1f])(local_b8);
      (*(((left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_IRNode)
        ._vptr_IRNode[7])();
      (*(((right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_IRNode
        )._vptr_IRNode[7])();
      auStack_78 = (undefined1  [8])local_d8;
      const_.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_d0;
      const_.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_b8[0];
      bVar12 = fmt::v7::to_string_view<char,_0>
                         ("left ({0})\'s width does not match with right ({1}). {2} <- {3}");
      format_str_01.data_ = (char *)bVar12.size_;
      format_str_01.size_ = 0x22dd;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)auStack_78;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)&stack0xffffffffffffff68,(detail *)bVar12.data_,format_str_01,args_01);
      local_e8 = (left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_e0 = (right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      __l_01._M_len = 2;
      __l_01._M_array = (iterator)&local_e8;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                 auStack_78,__l_01,&local_31);
      VarException::VarException
                (pVVar11,(string *)&stack0xffffffffffffff68,
                 (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                 auStack_78);
      __cxa_throw(pVVar11,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
    this->right_ = (right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  peVar1 = (left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  puVar4 = (peVar1->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (((*puVar4 < 2) &&
      ((ulong)((long)(peVar1->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4) < 5)) &&
     (peVar1->explicit_array_ == false)) {
    peVar2 = (right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    puVar4 = (peVar2->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    if (((*puVar4 < 2) &&
        ((ulong)((long)(peVar2->size_).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar4) < 5)) &&
       (peVar2->explicit_array_ != true)) {
      return;
    }
  }
  iVar6 = (*(peVar1->super_IRNode)._vptr_IRNode[0x18])();
  iVar7 = (*(((right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_IRNode)._vptr_IRNode[0x18])();
  if ((char)iVar6 == (char)iVar7) {
    return;
  }
  iVar6 = (*(((left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_IRNode)._vptr_IRNode[0x18])();
  this_00 = (StmtException *)__cxa_allocate_exception(0x10);
  if ((char)iVar6 == '\0') {
    (*(((left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_IRNode).
      _vptr_IRNode[0x1f])(&local_d8);
    (*(((right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_IRNode).
      _vptr_IRNode[0x1f])(local_b8);
    auStack_78 = (undefined1  [8])local_d8;
    const_.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_d0;
    const_.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_b8[0];
    bVar12 = fmt::v7::to_string_view<char,_0>("right ({1}) is packed array but left ({0}) is not.");
    format_str_02.data_ = (char *)bVar12.size_;
    format_str_02.size_ = 0xdd;
    args_02.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_02.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)auStack_78;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)&stack0xffffffffffffff68,(detail *)bVar12.data_,format_str_02,args_02);
    local_e8 = (left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_e0 = (right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    __l_02._M_len = 2;
    __l_02._M_array = (iterator)&local_e8;
    std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
              ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_78,__l_02,
               (allocator_type *)&local_31);
    StmtException::StmtException
              (this_00,(string *)&stack0xffffffffffffff68,
               (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_78);
    __cxa_throw(this_00,&StmtException::typeinfo,std::runtime_error::~runtime_error);
  }
  (*(((left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_IRNode).
    _vptr_IRNode[0x1f])(&local_d8);
  (*(((right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_IRNode).
    _vptr_IRNode[0x1f])(local_b8);
  auStack_78 = (undefined1  [8])local_d8;
  const_.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_d0;
  const_.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_b8[0];
  bVar12 = fmt::v7::to_string_view<char,_0>("left ({0}) is packed array but right ({1}) is not.");
  format_str_00.data_ = (char *)bVar12.size_;
  format_str_00.size_ = 0xdd;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)auStack_78;
  fmt::v7::detail::vformat_abi_cxx11_
            ((string *)&stack0xffffffffffffff68,(detail *)bVar12.data_,format_str_00,args_00);
  local_e8 = (left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_e0 = (right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_e8;
  std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
            ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_78,__l_00,
             (allocator_type *)&local_31);
  StmtException::StmtException
            (this_00,(string *)&stack0xffffffffffffff68,
             (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_78);
  __cxa_throw(this_00,&StmtException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

AssignStmt::AssignStmt(const std::shared_ptr<Var> &left, std::shared_ptr<Var> right,
                       AssignmentType type)
    : Stmt(StatementType ::Assign), left_(left.get()), right_(right.get()), assign_type_(type) {
    if (left == nullptr) throw UserException("left hand side is empty");
    if (right == nullptr) throw UserException("right hand side is empty");
    // check for sign
    if (left->is_signed() != right->is_signed()) {
        throw VarException(
            ::format("left ({0})'s sign does not match with right ({1}). {2} <- {3}",
                     left->to_string(), right->to_string(), left->is_signed(), right->is_signed()),
            {left.get(), right.get()});
    }
    // check for width
    if (left->width() != right->width()) {
        // up scale or down scale if the right hand side is a const, and it is allowed
        bool has_error = true;
        if (right->type() == VarType::ConstValue) {
            auto const_ = right->as<Const>();
            if (Const::is_legal(const_->value(), left->width(), left->is_signed()) ==
                Const::ConstantLegal::Legal) {
                has_error = false;
                const_->set_width(left->width());
            }
        } else if (IterVar::has_iter_var(right.get())) {
            // need to resize it
            if (IterVar::safe_to_resize(right.get(), left->width(), left->is_signed())) {
                // fix the width
                auto *right_ptr = right.get();
                IterVar::fix_width(right_ptr, left->width());
                right = right_ptr->shared_from_this();
                has_error = false;
            }
        }
        if (has_error || left->width() != right->width()) {
            throw VarException(
                ::format("left ({0})'s width does not match with right ({1}). {2} <- {3}",
                         left->to_string(), right->to_string(), left->width(), right->width()),
                {left.get(), right.get()});
        } else {
            // reassign
            right_ = right.get();
        }
    }
    if (((left->size().front() > 1 || left->size().size() > 1 || left->explicit_array()) ||
         (right->size().front() > 1 || right->size().size() > 1 || right->explicit_array())) &&
        left->is_packed() != right->is_packed()) {
        if (left->is_packed())
            throw StmtException(::format("left ({0}) is packed array but right ({1}) is not.",
                                         left->to_string(), right->to_string()),
                                {left.get(), right.get()});
        else
            throw StmtException(::format("right ({1}) is packed array but left ({0}) is not.",
                                         left->to_string(), right->to_string()),
                                {left.get(), right.get()});
    }
}